

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsSat.c
# Opt level: O1

int Abc_NtkMfsSolveSat_iter(Mfs_Man_t *p)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  sat_solver *psVar3;
  int iVar4;
  uint uVar5;
  ABC_INT64_T nConfLimit;
  long lVar6;
  int Lits [12];
  uint local_38 [12];
  
  iVar4 = p->nTotConfLim;
  if ((long)iVar4 != 0) {
    if ((long)iVar4 <= (p->pSat->stats).conflicts) {
      return -1;
    }
    if (iVar4 != 0) {
      nConfLimit = (ABC_INT64_T)(iVar4 - (int)(p->pSat->stats).conflicts);
      goto LAB_004caa69;
    }
  }
  nConfLimit = 0;
LAB_004caa69:
  iVar4 = sat_solver_solve(p->pSat,(lit *)0x0,(lit *)0x0,nConfLimit,0,0,0);
  if (2 < iVar4 + 1U) {
    __assert_fail("RetValue == l_Undef || RetValue == l_True || RetValue == l_False",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/mfs/mfsSat.c"
                  ,0x36,"int Abc_NtkMfsSolveSat_iter(Mfs_Man_t *)");
  }
  if (iVar4 == 0) {
    uVar5 = 0xffffffff;
  }
  else if (iVar4 == -1) {
    uVar5 = 0;
  }
  else {
    p->nCares = p->nCares + 1;
    pVVar1 = p->vProjVarsSat;
    if (pVVar1->nSize < 1) {
      uVar5 = 0;
    }
    else {
      piVar2 = pVVar1->pArray;
      psVar3 = p->pSat;
      lVar6 = 0;
      uVar5 = 0;
      do {
        iVar4 = piVar2[lVar6];
        local_38[lVar6] = iVar4 * 2;
        if (((long)iVar4 < 0) || (psVar3->size <= iVar4)) {
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                        ,0xda,"int sat_solver_var_value(sat_solver *, int)");
        }
        if (psVar3->model[iVar4] == 1) {
          uVar5 = uVar5 | 1 << ((uint)lVar6 & 0x1f);
          local_38[lVar6] = iVar4 * 2 | 1;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < pVVar1->nSize);
    }
    if ((p->uCare[(int)uVar5 >> 5] >> (uVar5 & 0x1f) & 1) != 0) {
      __assert_fail("!Abc_InfoHasBit(p->uCare, Mint)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/mfs/mfsSat.c"
                    ,0x4b,"int Abc_NtkMfsSolveSat_iter(Mfs_Man_t *)");
    }
    p->uCare[(int)uVar5 >> 5] = p->uCare[(int)uVar5 >> 5] | 1 << (uVar5 & 0x1f);
    iVar4 = sat_solver_addclause(p->pSat,(lit *)local_38,(lit *)(local_38 + pVVar1->nSize));
    uVar5 = (uint)(iVar4 != 0);
  }
  return uVar5;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Enumerates through the SAT assignments.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Abc_NtkMfsSolveSat_iter( Mfs_Man_t * p )
{
    int Lits[MFS_FANIN_MAX];
    int RetValue, nBTLimit, iVar, b, Mint;
//    int nConfs = p->pSat->stats.conflicts;
    if ( p->nTotConfLim && p->nTotConfLim <= p->pSat->stats.conflicts )
        return -1;
    nBTLimit = p->nTotConfLim? p->nTotConfLim - p->pSat->stats.conflicts : 0;
    RetValue = sat_solver_solve( p->pSat, NULL, NULL, (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    assert( RetValue == l_Undef || RetValue == l_True || RetValue == l_False );
//printf( "%c", RetValue==l_Undef ? '?' : (RetValue==l_False ? '-' : '+') );
//printf( "%d ", p->pSat->stats.conflicts-nConfs );
//if ( RetValue==l_False )
//printf( "\n" );
    if ( RetValue == l_Undef )
        return -1;
    if ( RetValue == l_False )
        return 0;
    p->nCares++;
    // add SAT assignment to the solver
    Mint = 0;
    Vec_IntForEachEntry( p->vProjVarsSat, iVar, b )
    {
        Lits[b] = toLit( iVar );
        if ( sat_solver_var_value( p->pSat, iVar ) )
        {
            Mint |= (1 << b);
            Lits[b] = lit_neg( Lits[b] );
        }
    }
    assert( !Abc_InfoHasBit(p->uCare, Mint) );
    Abc_InfoSetBit( p->uCare, Mint );
    // add the blocking clause
    RetValue = sat_solver_addclause( p->pSat, Lits, Lits + Vec_IntSize(p->vProjVarsSat) );
    if ( RetValue == 0 )
        return 0;
    return 1;
}